

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestString.cpp
# Opt level: O3

void __thiscall UnitTest_string2::UnitTest_string2(UnitTest_string2 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_00187680;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x1684b9);
  return;
}

Assistant:

TEST_CASE(string2)
{
    luna::String str1("abc");
    luna::String str2("def");
    luna::String str3("abcdefghijklmn");
    luna::String str4("abcdefghijklmnopqrst");
    luna::StringPool pool;

    pool.AddString(&str1);
    pool.AddString(&str2);
    pool.AddString(&str3);
    pool.AddString(&str4);

    auto s1 = pool.GetString("abc");
    auto s2 = pool.GetString("def");
    auto s3 = pool.GetString("abcdefghijklmn");
    auto s4 = pool.GetString("abcdefghijklmnopqrst");
    EXPECT_TRUE(s1 == &str1);
    EXPECT_TRUE(s2 == &str2);
    EXPECT_TRUE(s3 == &str3);
    EXPECT_TRUE(s4 == &str4);

    auto s5 = pool.GetString("abcdef");
    EXPECT_TRUE(!s5);

    pool.DeleteString(&str1);
    pool.DeleteString(&str2);
    pool.DeleteString(&str3);
    pool.DeleteString(&str4);

    s1 = pool.GetString("abc");
    s2 = pool.GetString("def");
    s3 = pool.GetString("abcdefghijklmn");
    s4 = pool.GetString("abcdefghijklmnopqrst");
    EXPECT_TRUE(!s1);
    EXPECT_TRUE(!s2);
    EXPECT_TRUE(!s3);
    EXPECT_TRUE(!s4);
}